

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O3

int Ssw_StrSimMatchingCountUnmached(Aig_Man_t *p)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  
  lVar3 = (long)p->vObjs->nSize;
  if (0 < lVar3) {
    lVar4 = 0;
    iVar2 = 0;
    do {
      pvVar1 = p->vObjs->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) &&
         ((uVar5 = *(uint *)((long)pvVar1 + 0x18) & 7, uVar5 == 2 || (uVar5 - 5 < 2)))) {
        if (p->pReprs == (Aig_Obj_t **)0x0) {
          uVar5 = 1;
        }
        else {
          uVar5 = (uint)(p->pReprs[*(int *)((long)pvVar1 + 0x24)] == (Aig_Obj_t *)0x0);
        }
        iVar2 = iVar2 + uVar5;
      }
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
    return iVar2;
  }
  return 0;
}

Assistant:

int Ssw_StrSimMatchingCountUnmached( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter = 0;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        if ( Aig_ObjRepr( p, pObj ) != NULL )
            continue;
        Counter++;
    }
    return Counter;
}